

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O0

xmlXPathObjectPtr xmlXPtrEval(xmlChar *str,xmlXPathContextPtr ctx)

{
  xmlNodeSetPtr pxVar1;
  xmlXPathParserContextPtr ctxt_00;
  xmlXPathObjectPtr obj;
  xmlNodeSetPtr set;
  int stack;
  xmlXPathObjectPtr init;
  xmlXPathObjectPtr tmp;
  xmlXPathObjectPtr res;
  xmlXPathParserContextPtr ctxt;
  xmlXPathContextPtr ctx_local;
  xmlChar *str_local;
  
  tmp = (xmlXPathObjectPtr)0x0;
  set._4_4_ = 0;
  xmlInitParser();
  if ((ctx == (xmlXPathContextPtr)0x0) || (str == (xmlChar *)0x0)) {
    str_local = (xmlChar *)0x0;
  }
  else {
    ctxt_00 = xmlXPathNewParserContext(str,ctx);
    if (ctxt_00 == (xmlXPathParserContextPtr)0x0) {
      str_local = (xmlChar *)0x0;
    }
    else {
      xmlXPtrEvalXPointer(ctxt_00);
      if ((ctxt_00->value == (xmlXPathObjectPtr)0x0) || (ctxt_00->value->type == XPATH_NODESET)) {
        tmp = valuePop(ctxt_00);
      }
      else {
        xmlXPtrErr(ctxt_00,0x76e,"xmlXPtrEval: evaluation failed to return a node set\n",
                   (xmlChar *)0x0);
      }
      do {
        obj = valuePop(ctxt_00);
        if (obj != (xmlXPathObjectPtr)0x0) {
          if (obj != (xmlXPathObjectPtr)0x0) {
            if (obj->type == XPATH_NODESET) {
              pxVar1 = obj->nodesetval;
              if (((pxVar1 == (xmlNodeSetPtr)0x0) || (pxVar1->nodeNr != 1)) ||
                 ((xmlDocPtr)*pxVar1->nodeTab != ctx->doc)) {
                set._4_4_ = set._4_4_ + 1;
              }
            }
            else {
              set._4_4_ = set._4_4_ + 1;
            }
          }
          xmlXPathFreeObject(obj);
        }
      } while (obj != (xmlXPathObjectPtr)0x0);
      if (set._4_4_ != 0) {
        xmlXPtrErr(ctxt_00,0x76f,"xmlXPtrEval: object(s) left on the eval stack\n",(xmlChar *)0x0);
      }
      if (ctxt_00->error != 0) {
        xmlXPathFreeObject(tmp);
        tmp = (xmlXPathObjectPtr)0x0;
      }
      xmlXPathFreeParserContext(ctxt_00);
      str_local = (xmlChar *)tmp;
    }
  }
  return (xmlXPathObjectPtr)str_local;
}

Assistant:

xmlXPathObjectPtr
xmlXPtrEval(const xmlChar *str, xmlXPathContextPtr ctx) {
    xmlXPathParserContextPtr ctxt;
    xmlXPathObjectPtr res = NULL, tmp;
    xmlXPathObjectPtr init = NULL;
    int stack = 0;

    xmlInitParser();

    if ((ctx == NULL) || (str == NULL))
	return(NULL);

    ctxt = xmlXPathNewParserContext(str, ctx);
    if (ctxt == NULL)
	return(NULL);
    xmlXPtrEvalXPointer(ctxt);

    if ((ctxt->value != NULL) &&
#ifdef LIBXML_XPTR_LOCS_ENABLED
	(ctxt->value->type != XPATH_LOCATIONSET) &&
#endif
	(ctxt->value->type != XPATH_NODESET)) {
        xmlXPtrErr(ctxt, XML_XPTR_EVAL_FAILED,
		"xmlXPtrEval: evaluation failed to return a node set\n",
		   NULL);
    } else {
	res = valuePop(ctxt);
    }

    do {
        tmp = valuePop(ctxt);
	if (tmp != NULL) {
	    if (tmp != init) {
		if (tmp->type == XPATH_NODESET) {
		    /*
		     * Evaluation may push a root nodeset which is unused
		     */
		    xmlNodeSetPtr set;
		    set = tmp->nodesetval;
		    if ((set == NULL) || (set->nodeNr != 1) ||
			(set->nodeTab[0] != (xmlNodePtr) ctx->doc))
			stack++;
		} else
		    stack++;
	    }
	    xmlXPathFreeObject(tmp);
        }
    } while (tmp != NULL);
    if (stack != 0) {
        xmlXPtrErr(ctxt, XML_XPTR_EXTRA_OBJECTS,
		   "xmlXPtrEval: object(s) left on the eval stack\n",
		   NULL);
    }
    if (ctxt->error != XPATH_EXPRESSION_OK) {
	xmlXPathFreeObject(res);
	res = NULL;
    }

    xmlXPathFreeParserContext(ctxt);
    return(res);
}